

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall SmallArray<Lexeme,_32U>::grow(SmallArray<Lexeme,_32U> *this,uint newSize)

{
  undefined4 uVar1;
  uint uVar2;
  Lexeme *pLVar3;
  Lexeme *pLVar4;
  uint local_24;
  Lexeme *pLStack_20;
  uint i;
  Lexeme *newData;
  uint newSize_local;
  SmallArray<Lexeme,_32U> *this_local;
  
  if (newSize < this->max + (this->max >> 1)) {
    newData._4_4_ = this->max + (this->max >> 1);
  }
  else {
    newData._4_4_ = newSize + 4;
  }
  if (this->allocator == (Allocator *)0x0) {
    pLStack_20 = NULLC::construct<Lexeme>(newData._4_4_);
  }
  else {
    pLStack_20 = Allocator::construct<Lexeme>(this->allocator,newData._4_4_);
  }
  for (local_24 = 0; local_24 < this->count; local_24 = local_24 + 1) {
    pLVar4 = this->data + local_24;
    pLVar3 = pLStack_20 + local_24;
    uVar1 = *(undefined4 *)&pLVar4->field_0x4;
    pLVar3->type = pLVar4->type;
    *(undefined4 *)&pLVar3->field_0x4 = uVar1;
    pLVar3->pos = pLVar4->pos;
    uVar2 = pLVar4->line;
    pLVar3->length = pLVar4->length;
    pLVar3->line = uVar2;
    uVar1 = *(undefined4 *)&pLVar4->field_0x1c;
    pLVar3->column = pLVar4->column;
    *(undefined4 *)&pLVar3->field_0x1c = uVar1;
  }
  if (this->data != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      NULLC::destruct<Lexeme>(this->data,(ulong)this->max);
    }
    else {
      Allocator::destruct<Lexeme>(this->allocator,this->data,(ulong)this->max);
    }
  }
  this->data = pLStack_20;
  this->max = newData._4_4_;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}